

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateProcessStringExpression(jx9_gen_state *pGen,char *zIn,char *zEnd)

{
  SyToken *pSVar1;
  sxi32 sVar2;
  undefined1 local_58 [4];
  sxi32 rc;
  SySet sToken;
  SyToken *pTmpEnd;
  SyToken *pTmpIn;
  char *zEnd_local;
  char *zIn_local;
  jx9_gen_state *pGen_local;
  
  SySetInit((SySet *)local_58,&pGen->pVm->sAllocator,0x20);
  SySetAlloc((SySet *)local_58,8);
  jx9Tokenize(zIn,(int)zEnd - (int)zIn,(SySet *)local_58);
  pSVar1 = pGen->pIn;
  sToken.pUserData = pGen->pEnd;
  pGen->pIn = (SyToken *)sToken.pAllocator;
  pGen->pEnd = pGen->pIn + (uint)sToken.pBase;
  sVar2 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
  pGen->pIn = pSVar1;
  pGen->pEnd = (SyToken *)sToken.pUserData;
  SySetRelease((SySet *)local_58);
  return sVar2;
}

Assistant:

static sxi32 GenStateProcessStringExpression(
	jx9_gen_state *pGen, /* Code generator state */
	const char *zIn,     /* Raw expression */
	const char *zEnd     /* End of the expression */
	)
{
	SyToken *pTmpIn, *pTmpEnd;
	SySet sToken;
	sxi32 rc;
	/* Initialize the token set */
	SySetInit(&sToken, &pGen->pVm->sAllocator, sizeof(SyToken));
	/* Preallocate some slots */
	SySetAlloc(&sToken, 0x08);
	/* Tokenize the text */
	jx9Tokenize(zIn,(sxu32)(zEnd-zIn),&sToken);
	/* Swap delimiter */
	pTmpIn  = pGen->pIn;
	pTmpEnd = pGen->pEnd;
	pGen->pIn = (SyToken *)SySetBasePtr(&sToken);
	pGen->pEnd = &pGen->pIn[SySetUsed(&sToken)];
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Restore token stream */
	pGen->pIn  = pTmpIn;
	pGen->pEnd = pTmpEnd;
	/* Release the token set */
	SySetRelease(&sToken);
	/* Compilation result */
	return rc;
}